

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::changeEvent(QWidget *this,QEvent *event)

{
  short sVar1;
  long lVar2;
  long *plVar3;
  char cVar4;
  QStyle *pQVar5;
  long in_FS_OFFSET;
  code *local_48;
  undefined1 *puStack_40;
  QWidget *pQStack_38;
  undefined8 local_30;
  undefined8 local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = *(short *)(event + 8);
  if (sVar1 == 0x27) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      update(this);
      return;
    }
    goto LAB_0030007e;
  }
  if (sVar1 == 0x61) {
LAB_002fff50:
    lVar2 = *(long *)&this->field_0x8;
    update(this);
    updateGeometry(this);
    plVar3 = *(long **)(lVar2 + 0x98);
    if (plVar3 != (long *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        (**(code **)(*plVar3 + 0x70))();
        return;
      }
      goto LAB_0030007e;
    }
  }
  else if (sVar1 == 0xd2) {
    cVar4 = QGuiApplication::desktopSettingsAware();
    if (((cVar4 != '\0') &&
        ((char)(this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i != '\x11')) && (QCoreApplication::self != 0)) {
      cVar4 = QCoreApplication::closingDown();
      if (cVar4 == '\0') {
        if ((*(byte *)(*(long *)&this->field_0x8 + 0x244) & 4) != 0) {
          pQVar5 = QApplication::style();
          (**(code **)(*(long *)pQVar5 + 0x68))(pQVar5,this);
          if ((*(byte *)(*(long *)&this->field_0x8 + 0x244) & 4) != 0) {
            pQVar5 = QApplication::style();
            (**(code **)(*(long *)pQVar5 + 0x60))(pQVar5,this);
          }
        }
        local_48 = (code *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_48,StyleChange);
        QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_48);
        if ((this->data->widget_attributes & 0x8000) != 0) {
          update(this);
        }
        QEvent::~QEvent((QEvent *)&local_48);
      }
    }
  }
  else {
    if (sVar1 == 100) goto LAB_002fff50;
    if (sVar1 == 0x62) {
      update(this);
      local_30 = 0xaaaaaaaaffffffff;
      local_48 = QCss::ValueExtractor::extractGeometry;
      local_28 = 1;
      puStack_40 = (undefined1 *)0xaaaaaaaa0000800a;
      pQStack_38 = this;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
      QAccessibleStateChangeEvent::~QAccessibleStateChangeEvent
                ((QAccessibleStateChangeEvent *)&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0030007e:
  __stack_chk_fail();
}

Assistant:

void QWidget::changeEvent(QEvent * event)
{
    switch(event->type()) {
    case QEvent::EnabledChange: {
        update();
#if QT_CONFIG(accessibility)
        QAccessible::State s;
        s.disabled = true;
        QAccessibleStateChangeEvent event(this, s);
        QAccessible::updateAccessibility(&event);
#endif
        break;
    }

    case QEvent::FontChange:
    case QEvent::StyleChange: {
        Q_D(QWidget);
        update();
        updateGeometry();
        if (d->layout)
            d->layout->invalidate();
        break;
    }

    case QEvent::PaletteChange:
        update();
        break;

    case QEvent::ThemeChange:
        if (QGuiApplication::desktopSettingsAware() && windowType() != Qt::Desktop
            && qApp && !QCoreApplication::closingDown()) {
            if (testAttribute(Qt::WA_WState_Polished))
                QApplication::style()->unpolish(this);
            if (testAttribute(Qt::WA_WState_Polished))
                QApplication::style()->polish(this);
            QEvent styleChangedEvent(QEvent::StyleChange);
            QCoreApplication::sendEvent(this, &styleChangedEvent);
            if (isVisible())
                update();
        }
        break;

#ifdef Q_OS_MAC
    case QEvent::MacSizeChange:
        updateGeometry();
        break;
#endif

    default:
        break;
    }
}